

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::DeferCallScope::DeferCallScope
          (DeferCallScope *this,cmMakefile *mf,string *deferredFromFile)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmState *this_00;
  cmStateSnapshot local_38;
  string *local_20;
  string *deferredFromFile_local;
  cmMakefile *mf_local;
  DeferCallScope *this_local;
  
  this->Makefile = mf;
  local_20 = deferredFromFile;
  deferredFromFile_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  this_00 = GetState(this->Makefile);
  cmState::CreateDeferCallSnapshot(&local_38,this_00,&this->Makefile->StateSnapshot,local_20);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).State = local_38.State;
  (pcVar1->StateSnapshot).Position.Tree = local_38.Position.Tree;
  (pcVar1->StateSnapshot).Position.Position = local_38.Position.Position;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (!bVar2) {
    __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x2c6,
                  "cmMakefile::DeferCallScope::DeferCallScope(cmMakefile *, const std::string &)");
  }
  return;
}

Assistant:

DeferCallScope(cmMakefile* mf, std::string const& deferredFromFile)
    : Makefile(mf)
  {
    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateDeferCallSnapshot(
        this->Makefile->StateSnapshot, deferredFromFile);
    assert(this->Makefile->StateSnapshot.IsValid());
  }